

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

string * __thiscall
cmCTestGIT::CommitParser::FormatDateTime_abi_cxx11_
          (string *__return_storage_ptr__,CommitParser *this,Person *person)

{
  tm *ptVar1;
  char local_478 [8];
  char tz [32];
  allocator local_43a;
  undefined1 local_439;
  char local_438 [8];
  char dt [1024];
  tm *t;
  time_t seconds;
  Person *person_local;
  CommitParser *this_local;
  string *out;
  
  t = (tm *)person->Time;
  seconds = (time_t)person;
  person_local = (Person *)this;
  this_local = (CommitParser *)__return_storage_ptr__;
  ptVar1 = gmtime((time_t *)&t);
  sprintf(local_438,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          ptVar1->tm_min,ptVar1->tm_sec);
  local_439 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_438,&local_43a);
  std::allocator<char>::~allocator((allocator<char> *)&local_43a);
  if (*(long *)(seconds + 0x48) < 0) {
    sprintf(local_478," -%04ld",-*(long *)(seconds + 0x48));
  }
  else {
    sprintf(local_478," +%04ld",*(undefined8 *)(seconds + 0x48));
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_478);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatDateTime(Person const& person)
    {
    // Convert the time to a human-readable format that is also easy
    // to machine-parse: "CCYY-MM-DD hh:mm:ss".
    time_t seconds = static_cast<time_t>(person.Time);
    struct tm* t = gmtime(&seconds);
    char dt[1024];
    sprintf(dt, "%04d-%02d-%02d %02d:%02d:%02d",
            t->tm_year+1900, t->tm_mon+1, t->tm_mday,
            t->tm_hour, t->tm_min, t->tm_sec);
    std::string out = dt;

    // Add the time-zone field "+zone" or "-zone".
    char tz[32];
    if(person.TimeZone >= 0)
      {
      sprintf(tz, " +%04ld", person.TimeZone);
      }
    else
      {
      sprintf(tz, " -%04ld", -person.TimeZone);
      }
    out += tz;
    return out;
    }